

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O2

void __thiscall Palette::~Palette(Palette *this)

{
  Colour *this_00;
  _Rb_tree<int,std::pair<int_const,Colour*>,std::_Select1st<std::pair<int_const,Colour*>>,std::less<int>,std::allocator<std::pair<int_const,Colour*>>>
  *this_01;
  _Base_ptr p_Var1;
  _Self __tmp;
  iterator __position;
  _Rb_tree<int,_std::pair<const_int,_Colour_*>,_std::_Select1st<std::pair<const_int,_Colour_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_>
  *this_02;
  
  this_02 = &this->colours->_M_t;
  __position._M_node =
       (((_Rep_type *)&this_02->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)__position._M_node != &(this_02->_M_impl).super__Rb_tree_header) {
    this_00 = (Colour *)__position._M_node[1]._M_parent;
    if (this_00 != (Colour *)0x0) {
      Colour::~Colour(this_00);
    }
    operator_delete(this_00);
    this_01 = (_Rb_tree<int,std::pair<int_const,Colour*>,std::_Select1st<std::pair<int_const,Colour*>>,std::less<int>,std::allocator<std::pair<int_const,Colour*>>>
               *)this->colours;
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
    std::
    _Rb_tree<int,std::pair<int_const,Colour*>,std::_Select1st<std::pair<int_const,Colour*>>,std::less<int>,std::allocator<std::pair<int_const,Colour*>>>
    ::erase_abi_cxx11_(this_01,__position);
    __position._M_node = p_Var1;
    this_02 = &this->colours->_M_t;
  }
  if (this_02 !=
      (_Rb_tree<int,_std::pair<const_int,_Colour_*>,_std::_Select1st<std::pair<const_int,_Colour_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_>
       *)0x0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_Colour_*>,_std::_Select1st<std::pair<const_int,_Colour_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_>
    ::~_Rb_tree(this_02);
  }
  operator_delete(this_02);
  this->colours =
       (map<int,_Colour_*,_std::less<int>,_std::allocator<std::pair<const_int,_Colour_*>_>_> *)0x0;
  return;
}

Assistant:

Palette::~Palette() {
    map<int, Colour*>::iterator it;
    for (it = colours->begin(); it != colours->end();) {
        delete it->second;
        colours->erase(it++);
    }
    delete colours;
    colours = nullptr;
}